

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::io::EpsCopyOutputStream::GetDirectBufferForNBytesAndAdvance
          (EpsCopyOutputStream *this,int size,uint8 **pp)

{
  int size_00;
  uint8 *puVar1;
  long *in_RDX;
  int in_ESI;
  EpsCopyOutputStream *in_RDI;
  uint8 *res;
  int s;
  uint8 *in_stack_000000e0;
  EpsCopyOutputStream *in_stack_000000e8;
  uint8 *local_8;
  
  if ((in_RDI->had_error_ & 1U) == 0) {
    size_00 = Flush(in_stack_000000e8,in_stack_000000e0);
    if ((in_RDI->had_error_ & 1U) == 0) {
      if (size_00 < in_ESI) {
        puVar1 = SetInitialBuffer(in_RDI,in_RDI->buffer_end_,size_00);
        *in_RDX = (long)puVar1;
        local_8 = (uint8 *)0x0;
      }
      else {
        local_8 = in_RDI->buffer_end_;
        puVar1 = SetInitialBuffer(in_RDI,in_RDI->buffer_end_ + in_ESI,size_00 - in_ESI);
        *in_RDX = (long)puVar1;
      }
    }
    else {
      *in_RDX = (long)in_RDI->buffer_;
      local_8 = (uint8 *)0x0;
    }
  }
  else {
    *in_RDX = (long)in_RDI->buffer_;
    local_8 = (uint8 *)0x0;
  }
  return local_8;
}

Assistant:

uint8* EpsCopyOutputStream::GetDirectBufferForNBytesAndAdvance(int size,
                                                               uint8** pp) {
  if (had_error_) {
    *pp = buffer_;
    return nullptr;
  }
  int s = Flush(*pp);
  if (had_error_) {
    *pp = buffer_;
    return nullptr;
  }
  if (s >= size) {
    auto res = buffer_end_;
    *pp = SetInitialBuffer(buffer_end_ + size, s - size);
    return res;
  } else {
    *pp = SetInitialBuffer(buffer_end_, s);
    return nullptr;
  }
}